

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O3

Vec_Int_t *
Wlc_NtkDeriveFirstTotal
          (Wlc_Ntk_t *p,Vec_Int_t *vMemObjs,Vec_Int_t *vMemFanins,int iFirstMemPi,int iFirstMemCi,
          int fVerbose)

{
  Wlc_Obj_t *pWVar1;
  ushort uVar2;
  int iVar3;
  int *piVar4;
  Wlc_Obj_t *pWVar5;
  ulong uVar6;
  int iVar7;
  Vec_Int_t *pVVar8;
  int *__s;
  char *pcVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int *piVar13;
  long lVar14;
  int iVar15;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  
  iVar3 = vMemObjs->nSize;
  uVar6 = (long)iVar3 * 3;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  iVar7 = (int)uVar6;
  iVar10 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar10 = iVar7;
  }
  pVVar8->nCap = iVar10;
  if (iVar10 == 0) {
    pVVar8->pArray = (int *)0x0;
    pVVar8->nSize = iVar7;
  }
  else {
    __s = (int *)malloc((long)iVar10 << 2);
    pVVar8->pArray = __s;
    pVVar8->nSize = iVar7;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)iVar3 * 0xc);
      goto LAB_0035f284;
    }
  }
  __s = (int *)0x0;
LAB_0035f284:
  if (iVar3 < 1) {
    iVar10 = 0;
  }
  else {
    piVar4 = vMemObjs->pArray;
    iVar11 = 0;
    lVar14 = 0;
    iVar10 = 0;
    piVar13 = __s;
    do {
      iVar19 = piVar4[lVar14];
      if (((long)iVar19 < 1) || (p->nObjsAlloc <= iVar19)) {
LAB_0035f552:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar5 = p->pObjs;
      pWVar1 = pWVar5 + iVar19;
      uVar2 = *(ushort *)pWVar1;
      if ((uVar2 & 0x3f) - 0x36 < 2) {
        uVar18 = pWVar1->nFanins;
        if (0 < (int)uVar18) {
          lVar17 = 0;
          do {
            if ((2 < uVar18) ||
               (paVar16 = &pWVar1->field_10, (*(uint *)pWVar1 & 0x3f | 0x10) == 0x16)) {
              paVar16 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
            }
            if (lVar17 != 0) {
              uVar18 = paVar16->Fanins[lVar17];
              if (((int)uVar18 < 1) || (p->nObjsAlloc <= (int)uVar18)) goto LAB_0035f552;
              if (iVar7 <= iVar11 + (int)lVar17) goto LAB_0035f571;
              iVar15 = pWVar5[uVar18].End - pWVar5[uVar18].Beg;
              iVar19 = -iVar15;
              if (0 < iVar15) {
                iVar19 = iVar15;
              }
              piVar13[lVar17] = iFirstMemCi << 10 | iVar19 + 1U;
              iVar15 = pWVar5[uVar18].End - pWVar5[uVar18].Beg;
              iVar19 = -iVar15;
              if (0 < iVar15) {
                iVar19 = iVar15;
              }
              iFirstMemCi = iFirstMemCi + iVar19 + 1;
              iVar10 = iVar10 + 1;
              uVar18 = pWVar1->nFanins;
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 < (int)uVar18);
          uVar2 = *(ushort *)pWVar1;
        }
        if ((uVar2 & 0x3f) == 0x36) {
          if (iVar7 <= (int)lVar14 * 3 + 2) {
LAB_0035f571:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          iVar15 = pWVar1->End - pWVar1->Beg;
          iVar19 = -iVar15;
          if (0 < iVar15) {
            iVar19 = iVar15;
          }
          __s[lVar14 * 3 + 2] = iFirstMemPi << 10 | iVar19 + 1U;
          iVar15 = pWVar1->End - pWVar1->Beg;
          iVar19 = -iVar15;
          if (0 < iVar15) {
            iVar19 = iVar15;
          }
          iFirstMemPi = iFirstMemPi + iVar19 + 1;
        }
      }
      else if ((uVar2 & 0x3f) == 8) {
        paVar16 = &pWVar1->field_10;
        if (2 < pWVar1->nFanins) {
          paVar16 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar16->pFanins[0];
        }
        lVar17 = (long)paVar16->Fanins[0];
        if ((lVar17 < 1) || ((uint)p->nObjsAlloc <= (uint)paVar16->Fanins[0])) goto LAB_0035f552;
        if (pWVar5[lVar17].End != pWVar5[lVar17].Beg) {
          __assert_fail("Wlc_ObjRange(pFanin) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                        ,0x2a8,
                        "Vec_Int_t *Wlc_NtkDeriveFirstTotal(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, int, int, int)"
                       );
        }
        if (iVar7 <= (int)lVar14 * 3) goto LAB_0035f571;
        __s[lVar14 * 3] = iFirstMemCi * 0x400 + 1;
        iVar15 = pWVar5[lVar17].End - pWVar5[lVar17].Beg;
        iVar19 = -iVar15;
        if (0 < iVar15) {
          iVar19 = iVar15;
        }
        iFirstMemCi = iFirstMemCi + iVar19 + 1;
        iVar10 = iVar10 + 1;
      }
      lVar14 = lVar14 + 1;
      piVar13 = piVar13 + 3;
      iVar11 = iVar11 + 3;
    } while (lVar14 < vMemObjs->nSize);
  }
  if (iVar10 != vMemFanins->nSize) {
    __assert_fail("nMemFanins == Vec_IntSize(vMemFanins)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                  ,0x2bf,
                  "Vec_Int_t *Wlc_NtkDeriveFirstTotal(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, int, int, int)"
                 );
  }
  if (0 < iVar3 && fVerbose != 0) {
    uVar12 = 0;
    do {
      uVar18 = __s[uVar12];
      uVar20 = uVar12 & 0xffffffff;
      printf("Obj %5d  Fanin %5d : ",uVar20 / 3,(ulong)(uint)((int)uVar12 + (int)(uVar20 / 3) * -3))
      ;
      if (vMemObjs->nSize <= (int)(uVar20 / 3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pcVar9 = Wlc_ObjName(p,vMemObjs->pArray[uVar20 / 3]);
      printf("%16s : %d(%d)\n",pcVar9,(ulong)(uint)((int)uVar18 >> 10),(ulong)(uVar18 & 0x3ff));
      uVar12 = uVar12 + 1;
    } while ((uVar6 & 0xffffffff) != uVar12);
  }
  return pVVar8;
}

Assistant:

Vec_Int_t * Wlc_NtkDeriveFirstTotal( Wlc_Ntk_t * p, Vec_Int_t * vMemObjs, Vec_Int_t * vMemFanins, int iFirstMemPi, int iFirstMemCi, int fVerbose )
{
    Vec_Int_t * vFirstTotal = Vec_IntStart( 3 * Vec_IntSize(vMemObjs) ); // contains pairs of (first CO bit: range) for each input/output of a node
    Wlc_Obj_t * pObj, * pFanin; int i, k, iFanin, nMemFanins = 0;
    Wlc_NtkForEachObjVec( vMemObjs, p, pObj, i )
    {
        if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
        {
            //Vec_IntPush( vMemFanins, Wlc_ObjFaninId0(pObj) );
            pFanin = Wlc_ObjFanin0(p, pObj);
            assert( Wlc_ObjRange(pFanin) == 1 );
            Vec_IntWriteEntry( vFirstTotal, 3*i, (iFirstMemCi << 10) | Wlc_ObjRange(pFanin) );
            iFirstMemCi += Wlc_ObjRange(pFanin);
            nMemFanins++;
        }
        else if ( Wlc_ObjType(pObj) == WLC_OBJ_READ || Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
        {
            Wlc_ObjForEachFanin( pObj, iFanin, k )
                if ( k > 0 )
                {
                    //Vec_IntPush( vMemFanins, iFanin );
                    pFanin = Wlc_NtkObj(p, iFanin);
                    Vec_IntWriteEntry( vFirstTotal, 3*i + k, (iFirstMemCi << 10) | Wlc_ObjRange(pFanin) );
                    iFirstMemCi += Wlc_ObjRange(pFanin);
                    nMemFanins++;
                }
            if ( Wlc_ObjType(pObj) == WLC_OBJ_READ )
            {
                Vec_IntWriteEntry( vFirstTotal, 3*i + 2, (iFirstMemPi << 10) | Wlc_ObjRange(pObj) );
                iFirstMemPi += Wlc_ObjRange(pObj);
            }
        }
    }
    assert( nMemFanins == Vec_IntSize(vMemFanins) );
    if ( fVerbose )
    Vec_IntForEachEntry( vFirstTotal, iFanin, i )
    {
        printf( "Obj %5d  Fanin %5d : ", i/3, i%3 );
        printf( "%16s : %d(%d)\n", Wlc_ObjName(p, Vec_IntEntry(vMemObjs, i/3)), iFanin >> 10, iFanin & 0x3FF );
    }
    return vFirstTotal;
}